

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O1

ostream * __thiscall beast::Journal::ScopedStream::operator<<(ScopedStream *this,char **t)

{
  char *__s;
  size_t sVar1;
  ostringstream *poVar2;
  
  poVar2 = &this->m_ostream;
  __s = *t;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,__s,sVar1);
  }
  return (ostream *)poVar2;
}

Assistant:

std::ostream&
Journal::ScopedStream::operator<< (T const& t) const
{
    m_ostream << t;
    return m_ostream;
}